

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

void Aig_ManRegPartitionTraverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLos)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  iVar2 = p->nTravIds;
  if (pObj->TravId != iVar2) {
    do {
      pObj->TravId = iVar2;
      if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
        if ((pObj->field_5).iData < p->nObjs[2] - p->nRegs) {
          return;
        }
        uVar1 = vLos->nSize;
        if (uVar1 == vLos->nCap) {
          if ((int)uVar1 < 0x10) {
            if (vLos->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(vLos->pArray,0x80);
            }
            vLos->pArray = ppvVar3;
            vLos->nCap = 0x10;
          }
          else {
            if (vLos->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar3 = (void **)realloc(vLos->pArray,(ulong)uVar1 << 4);
            }
            vLos->pArray = ppvVar3;
            vLos->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar3 = vLos->pArray;
        }
        iVar2 = vLos->nSize;
        vLos->nSize = iVar2 + 1;
        ppvVar3[iVar2] = pObj;
        printf("%d ",(ulong)(uint)(((pObj->field_5).iData - p->nObjs[2]) + p->nRegs));
        return;
      }
      Aig_ManRegPartitionTraverse_rec
                (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLos);
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar2 = p->nTravIds;
    } while (pObj->TravId != iVar2);
  }
  return;
}

Assistant:

void Aig_ManRegPartitionTraverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLos )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent( p, pObj );
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( pObj->iData >= Aig_ManCiNum(p) - Aig_ManRegNum(p) )
        {
            Vec_PtrPush( vLos, pObj );
            printf( "%d ", pObj->iData - (Aig_ManCiNum(p) - Aig_ManRegNum(p)) );
        }
        return;
    }
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin0(pObj), vLos );
    Aig_ManRegPartitionTraverse_rec( p, Aig_ObjFanin1(pObj), vLos );
}